

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64 __thiscall google::protobuf::Arena::FreeBlocks(Arena *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  uint64 uVar7;
  long *in_FS_OFFSET;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    plVar6 = (long *)0x0;
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    plVar4 = *(long **)(this + 8);
    plVar5 = (long *)0x0;
    do {
      plVar2 = (long *)plVar4[1];
      lVar3 = plVar4[3];
      if ((plVar2 != (long *)0x0) || (plVar6 = plVar4, this[0x28] == (Arena)0x1)) {
        (**(code **)(this + 0x68))(plVar4,lVar3);
        plVar6 = plVar5;
      }
      uVar7 = uVar7 + lVar3;
      plVar4 = plVar2;
      plVar5 = plVar6;
    } while (plVar2 != (long *)0x0);
  }
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (this[0x28] == (Arena)0x0) {
    plVar6[2] = 0x20;
    lVar3 = *in_FS_OFFSET;
    puVar1 = (undefined8 *)(lVar3 + -0x10);
    *plVar6 = (long)puVar1;
    *(long **)(lVar3 + -8) = plVar6;
    *puVar1 = *(undefined8 *)this;
    plVar6[1] = *(long *)(this + 8);
    *(long **)(this + 8) = plVar6;
    if (plVar6[3] != plVar6[2]) {
      *(long **)(this + 0x10) = plVar6;
    }
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + plVar6[3];
  }
  return uVar7;
}

Assistant:

uint64 Arena::FreeBlocks() {
  uint64 space_allocated = 0;
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  Block* first_block = NULL;
  while (b != NULL) {
    space_allocated += (b->size);
    Block* next = b->next;
    if (next != NULL) {
#ifdef ADDRESS_SANITIZER
      // This memory was provided by the underlying allocator as unpoisoned, so
      // return it in an unpoisoned state.
      ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
      options_.block_dealloc(b, b->size);
    } else {
      if (owns_first_block_) {
#ifdef ADDRESS_SANITIZER
        // This memory was provided by the underlying allocator as unpoisoned,
        // so return it in an unpoisoned state.
        ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
        options_.block_dealloc(b, b->size);
      } else {
        // User passed in the first block, skip free'ing the memory.
        first_block = b;
      }
    }
    b = next;
  }
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  if (!owns_first_block_) {
    // Make the first block that was passed in through ArenaOptions
    // available for reuse.
    first_block->pos = kHeaderSize;
    // Thread which calls Reset() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
  }
  return space_allocated;
}